

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

string * __thiscall
pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>::getType_abi_cxx11_
          (ParamArray<pbrt::syntactic::Texture> *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x18));
  return in_RDI;
}

Assistant:

virtual size_t getSize() const { return 1; }